

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O0

bool __thiscall BamTools::Internal::BamReaderPrivate::Seek(BamReaderPrivate *this,int64_t *position)

{
  bool bVar1;
  string message;
  string streamError;
  BamException *e;
  string *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  BamReaderPrivate *in_stack_ffffffffffffff20;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [56];
  
  bVar1 = IsOpen((BamReaderPrivate *)0x1a19a9);
  if (bVar1) {
    BgzfStream::Seek((BgzfStream *)streamError._M_string_length,(int64_t *)streamError._0_8_);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"BamReader::Seek",&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"cannot seek on unopened BAM file",&local_71);
    SetErrorString(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return bVar1;
}

Assistant:

bool BamReaderPrivate::Seek(const int64_t& position)
{

    // skip if BAM file not open
    if (!IsOpen()) {
        SetErrorString("BamReader::Seek", "cannot seek on unopened BAM file");
        return false;
    }

    try {
        m_stream.Seek(position);
        return true;
    } catch (const BamException& e) {
        const std::string streamError = e.what();
        const std::string message = std::string("could not seek in BAM file: \n\t") + streamError;
        SetErrorString("BamReader::Seek", message);
        return false;
    }
}